

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gccode.c
# Opt level: O0

LispPTR reclaimcodeblock(LispPTR codebase)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  fnhead *fnbase;
  LispPTR codebase_local;
  
  if ((*Closure_Cache_Enabled_word != 0) &&
     (LVar1 = remimplicitkeyhash(codebase,*Closure_Cache_word), LVar1 != 0)) {
    return 1;
  }
  pLVar2 = NativeAligned4FromLAddr(codebase);
  if (((*(ushort *)((ulong)(MDStypetbl + ((int)(pLVar2[2] & 0xfffffff) >> 9)) ^ 2) & 0x8000) == 0)
     && (*GcDisabled_word != 0x4c)) {
    rec_htfind(pLVar2[2] & 0xfffffff,1);
  }
  if ((short)pLVar2[1] != 0) {
    map_code_pointers(codebase,1);
  }
  return 0;
}

Assistant:

LispPTR reclaimcodeblock(LispPTR codebase) {
  struct fnhead *fnbase;
  if ((*Closure_Cache_Enabled_word != NIL) &&
      (remimplicitkeyhash(codebase, *Closure_Cache_word) != NIL)) {
    return (T);
  }
  fnbase = (struct fnhead *)NativeAligned4FromLAddr(codebase);
  REC_GCLOOKUP((POINTERMASK & fnbase->framename), DELREF);
  if (fnbase->startpc != 0) map_code_pointers(codebase, DELREF);
  return (NIL);
}